

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_spline::SetupData
          (ChFunctionRotation_spline *this,int morder,
          vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
          *mrotations,ChVectorDynamic<> *mknots)

{
  ChVectorDynamic<> *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index size;
  ulong uVar13;
  ChException *pCVar14;
  long lVar15;
  ActualDstType actualDst;
  string local_88;
  string local_68;
  string local_48;
  
  if (morder < 1) {
    pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"ChFunctionRotation_spline::SetupData requires order >= 1.","");
    ChException::ChException(pCVar14,&local_48);
    __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
  }
  uVar13 = (long)(mrotations->
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(mrotations->
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar13 < morder + 1) {
    pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "ChFunctionRotation_spline::SetupData requires at least order+1 control points.","");
    ChException::ChException(pCVar14,&local_68);
    __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots != (ChVectorDynamic<> *)0x0) &&
     ((mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(uint)morder + 1 + uVar13)) {
    pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "ChFunctionRotation_spline::SetupData: knots must have size=n_points+order+1","");
    ChException::ChException(pCVar14,&local_88);
    __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
  }
  this->p = morder;
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
  operator=(&this->rotations,mrotations);
  if (mknots == (ChVectorDynamic<> *)0x0) {
    this_00 = &this->knots;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(this->p + 1 +
                     (int)((ulong)((long)(this->rotations).
                                         super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->rotations).
                                        super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5)));
    lVar15 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (-1 < lVar15) {
      if (lVar15 != 0) {
        memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar15 << 3);
      }
      geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this_00,this->p,0.0,1.0);
      return;
    }
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pdVar3 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar13 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,
               1);
  }
  uVar4 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar4 == uVar13) {
    pdVar5 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar13 = uVar4 + 7;
    if (-1 < (long)uVar4) {
      uVar13 = uVar4;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar4) {
      lVar15 = 0;
      do {
        pdVar1 = pdVar3 + lVar15;
        dVar6 = pdVar1[1];
        dVar7 = pdVar1[2];
        dVar8 = pdVar1[3];
        dVar9 = pdVar1[4];
        dVar10 = pdVar1[5];
        dVar11 = pdVar1[6];
        dVar12 = pdVar1[7];
        pdVar2 = pdVar5 + lVar15;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        pdVar2[2] = dVar7;
        pdVar2[3] = dVar8;
        pdVar2[4] = dVar9;
        pdVar2[5] = dVar10;
        pdVar2[6] = dVar11;
        pdVar2[7] = dVar12;
        lVar15 = lVar15 + 8;
      } while (lVar15 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar4) {
      do {
        pdVar5[uVar13] = pdVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChFunctionRotation_spline::SetupData(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    const std::vector<ChQuaternion<> >& mrotations,  ///< rotation control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots           ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
) {
    if (morder < 1)
        throw ChException("ChFunctionRotation_spline::SetupData requires order >= 1.");

    if (mrotations.size() < morder + 1)
        throw ChException("ChFunctionRotation_spline::SetupData requires at least order+1 control points.");

    if (mknots && mknots->size() != (mrotations.size() + morder + 1))
        throw ChException("ChFunctionRotation_spline::SetupData: knots must have size=n_points+order+1");

    this->p = morder;
    this->rotations = mrotations;
    int n = (int)rotations.size();

    if (mknots)
        this->knots = *mknots;
    else {
        this->knots.setZero(n + p + 1);
        geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
    }
}